

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void __thiscall Pathie::Path::touch(Path *this)

{
  int iVar1;
  FILE *__stream;
  ErrnoError *this_00;
  int *piVar2;
  char *in_RDX;
  
  __stream = fopen(this,"a",in_RDX);
  iVar1 = fileno(__stream);
  iVar1 = futimens(iVar1,(timespec *)0x0);
  fclose(__stream);
  if (-1 < iVar1) {
    return;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

void Path::touch() const
{
#if defined(BSD) // FreeBSD didn’t have futimens() yet as of testing (december 2014)
  FILE* p_file = Path::fopen("a");
  if (futimes(fileno(p_file), NULL) < 0) {
    fclose(p_file);
    throw(Pathie::ErrnoError(errno));
  }

  fclose(p_file);
#elif defined(_PATHIE_UNIX)
  FILE* p_file = Path::fopen("a");
  // futimens() is considered the modern variant of doing this
  // (at least according to utimes(2) on my Linux system).
  if (futimens(fileno(p_file), NULL) < 0) {
    fclose(p_file);
    throw(Pathie::ErrnoError(errno));
  }

  fclose(p_file);
#elif defined(_WIN32)
  // Create file if it does not exist yet
  if (!exists()) {
    FILE* p_file = Path::fopen("a");
    fclose(p_file);
  }

  SYSTEMTIME currenttime;
  GetSystemTime(&currenttime);

  FILETIME newtime;
  if (SystemTimeToFileTime(&currenttime, &newtime) == 0) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }

  std::wstring utf16 = utf8_to_utf16(m_path);
  HANDLE filehandle = CreateFileW(utf16.c_str(), FILE_WRITE_ATTRIBUTES, 0, NULL, OPEN_EXISTING, 0, NULL);
  if (filehandle == INVALID_HANDLE_VALUE) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }

  if (SetFileTime(filehandle, NULL, &newtime, &newtime) == 0) {
    int errsav = GetLastError();
    CloseHandle(filehandle);
    throw(Pathie::WindowsError(errsav));
  }

  CloseHandle(filehandle);
#else
#error Unsupported system.
#endif
}